

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.hpp
# Opt level: O3

uint32_t __thiscall
ddd::DaTrie<false,_true,_false>::xcheck_
          (DaTrie<false,_true,_false> *this,Edge *edge,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  ulong uVar1;
  pointer pBVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = edge->size_;
  if (uVar1 == 1) {
    uVar3 = (uint)((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
    if (this->head_pos_ != 0xffffffff) {
      uVar3 = this->head_pos_;
    }
    return uVar3 ^ edge->labels_[0];
  }
  uVar3 = this->head_pos_;
  if (uVar3 != 0xffffffff) {
    pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = uVar3;
    do {
      if (uVar1 <= (blocks->super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar5 >> 8].num_emps) {
        uVar4 = uVar5 ^ edge->labels_[0];
        if (uVar1 == 0) {
          return uVar4;
        }
        uVar6 = 0;
        while (-1 < (long)pBVar2[edge->labels_[uVar6] ^ uVar4]) {
          uVar6 = uVar6 + 1;
          if (uVar1 == uVar6) {
            return uVar4;
          }
        }
      }
      uVar5 = *(uint *)(pBVar2 + uVar5) & 0x7fffffff;
    } while (uVar5 != uVar3);
    return (uint)edge->labels_[0] ^
           (uint)((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pBVar2) >> 3);
  }
  return (uint)edge->labels_[0] ^
         (uint)((ulong)((long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

size_t size() const { return size_; }